

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.hpp
# Opt level: O0

void __thiscall
duckdb::BatchCollectionChunkScanState::BatchCollectionChunkScanState
          (BatchCollectionChunkScanState *this,BatchCollectionChunkScanState *other)

{
  BatchedChunkScanState *in_RSI;
  BatchedChunkScanState *in_RDI;
  
  ChunkScanState::ChunkScanState((ChunkScanState *)in_RSI,(ChunkScanState *)in_RDI);
  (in_RDI->range).begin._M_node = (_Base_ptr)&PTR__BatchCollectionChunkScanState_03533b80;
  (in_RDI->scan_state).current_chunk_state.handles._M_h._M_before_begin._M_nxt =
       (in_RSI->scan_state).current_chunk_state.handles._M_h._M_before_begin._M_nxt;
  BatchedChunkScanState::BatchedChunkScanState(in_RSI,in_RDI);
  return;
}

Assistant:

BatchCollectionChunkScanState(BatchCollectionChunkScanState &&other) = default;